

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

enable_if_t<std::is_base_of<_::acto::actor,_Console>::value,_actor_ref> __thiscall
acto::spawn<Console>(acto *this,actor_thread thread_opt)

{
  actor_thread opt;
  object_t *an_object;
  unique_ptr<Console,_std::default_delete<Console>_> local_30;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> local_28;
  actor_ref local_20;
  actor_thread local_14;
  acto *paStack_10;
  actor_thread thread_opt_local;
  
  local_20.object_ = (object_t *)0x0;
  local_14 = thread_opt;
  paStack_10 = this;
  actor_ref::actor_ref(&local_20);
  opt = local_14;
  std::make_unique<Console>();
  std::unique_ptr<acto::actor,std::default_delete<acto::actor>>::
  unique_ptr<Console,std::default_delete<Console>,void>
            ((unique_ptr<acto::actor,std::default_delete<acto::actor>> *)&local_28,&local_30);
  an_object = core::make_instance(&local_20,opt,&local_28);
  actor_ref::actor_ref((actor_ref *)this,an_object,false);
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::~unique_ptr(&local_28);
  std::unique_ptr<Console,_std::default_delete<Console>_>::~unique_ptr(&local_30);
  actor_ref::~actor_ref(&local_20);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Console>::value,_actor_ref>)(object_t *)this;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(const actor_thread thread_opt, P&&... p) {
  return actor_ref(
    core::make_instance(actor_ref(), thread_opt,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}